

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O2

void __thiscall r_exec::HLPController::HLPController(HLPController *this,View *view)

{
  char cVar1;
  ushort uVar2;
  HLPBindingMap *this_00;
  Code *hlp;
  uint64_t uVar3;
  
  OController::OController(&this->super_OController,view);
  (this->super_OController).super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__HLPController_001d2068;
  this->strong_requirement_count = 0;
  this->weak_requirement_count = 0;
  this->requirement_count = 0;
  (this->evidences).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->evidences).mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->evidences).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->evidences).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->evidences).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->evidences).evidences.cells.
  super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->evidences).evidences.cells.
  super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->evidences).evidences.cells.
  super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->evidences).evidences.free_cells = -1;
  *(undefined4 *)&(this->evidences).evidences.used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->evidences).evidences.used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->evidences).evidences.used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->evidences).evidences.used_cells_tail + 4) = 0xffffffff;
  (this->evidences).evidences.used_cell_count = 0;
  (this->evidences).evidences.free_cell_count = 0;
  (this->predicted_evidences).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->predicted_evidences).mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->predicted_evidences).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->predicted_evidences).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->predicted_evidences).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->predicted_evidences).evidences.cells.
  super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predicted_evidences).evidences.cells.
  super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predicted_evidences).evidences.cells.
  super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&(this->predicted_evidences).evidences.used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->predicted_evidences).evidences.used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->predicted_evidences).evidences.used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->predicted_evidences).evidences.used_cells_tail + 4) = 0xffffffff;
  (this->predicted_evidences).evidences.free_cells = -1;
  (this->controllers).
  super__Vector_base<core::P<r_exec::HLPController>,_std::allocator<core::P<r_exec::HLPController>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->controllers).
  super__Vector_base<core::P<r_exec::HLPController>,_std::allocator<core::P<r_exec::HLPController>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->controllers).
  super__Vector_base<core::P<r_exec::HLPController>,_std::allocator<core::P<r_exec::HLPController>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->predicted_evidences).evidences.used_cell_count = 0;
  (this->predicted_evidences).evidences.free_cell_count = 0;
  (this->bindings).object = (_Object *)0x0;
  this_00 = (HLPBindingMap *)operator_new(0x40);
  HLPBindingMap::HLPBindingMap(this_00);
  core::P<r_exec::HLPBindingMap>::operator=(&this->bindings,this_00);
  hlp = get_unpacked_object(this);
  HLPBindingMap::init_from_hlp((HLPBindingMap *)(this->bindings).object,hlp);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,1);
  uVar2 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)uVar2);
  cVar1 = r_code::Atom::getAtomCount();
  this->_has_tpl_args = cVar1 != '\0';
  this->ref_count = 0;
  uVar3 = (*Now)();
  this->last_match_time = uVar3;
  return;
}

Assistant:

HLPController::HLPController(r_code::View *view): OController(view), strong_requirement_count(0), weak_requirement_count(0), requirement_count(0)
{
    bindings = new HLPBindingMap();
    Code *object = get_unpacked_object();
    bindings->init_from_hlp(object); // init a binding map from the patterns.
    _has_tpl_args = object->code(object->code(HLP_TPL_ARGS).asIndex()).getAtomCount() > 0;
    ref_count = 0;
    last_match_time = Now();
}